

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  stbi_uc sVar10;
  int num;
  ulong uVar11;
  char *pcVar12;
  stbi_uc *psVar13;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar7 = a->zbuffer;
    uVar1 = 0;
    if (pbVar7 < a->zbuffer_end) {
      a->zbuffer = pbVar7 + 1;
      uVar2 = (uint)*pbVar7;
      pbVar7 = pbVar7 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar7 < a->zbuffer_end) {
      a->zbuffer = pbVar7 + 1;
      uVar1 = (uint)*pbVar7;
    }
    if ((((uVar1 & 0x20) != 0) || ((short)((uVar2 << 8 | uVar1) % 0x1f) != 0)) ||
       ((uVar2 & 0xf) != 8)) {
      stbi__g_failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
LAB_0010401a:
  uVar1 = stbi__zreceive(a,1);
  uVar2 = stbi__zreceive(a,2);
  if (uVar2 != 0) {
    if (uVar2 != 1) {
      if (uVar2 == 3) {
        return 0;
      }
      uVar2 = stbi__zreceive(a,5);
      uVar3 = stbi__zreceive(a,5);
      uVar4 = stbi__zreceive(a,4);
      local_a08[0] = '\0';
      local_a08[1] = '\0';
      local_a08[2] = '\0';
      local_a08[3] = '\0';
      local_a08[4] = '\0';
      local_a08[5] = '\0';
      local_a08[6] = '\0';
      local_a08[7] = '\0';
      local_a08[8] = '\0';
      local_a08[9] = '\0';
      local_a08[10] = '\0';
      local_a08[0xb] = '\0';
      local_a08[0xc] = '\0';
      local_a08[0xd] = '\0';
      local_a08[0xe] = '\0';
      local_a08[0xf] = '\0';
      local_a08[0x10] = '\0';
      local_a08[0x11] = '\0';
      local_a08[0x12] = '\0';
      uVar8 = (ulong)(uVar4 + 4);
      if ((int)(uVar4 + 4) < 1) {
        uVar8 = 0;
      }
      for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        uVar4 = stbi__zreceive(a,3);
        local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar11]] =
             (stbi_uc)uVar4;
      }
      iVar5 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
      if (iVar5 == 0) {
        return 0;
      }
      iVar6 = uVar2 + 0x101;
      num = uVar3 + 1;
      iVar5 = 0;
LAB_00104133:
      do {
        if (num + iVar6 <= iVar5) goto LAB_001042d1;
        uVar2 = stbi__zhuffman_decode(a,&z_codelength);
        if (0x12 < uVar2) goto LAB_00104500;
        if (0xf < uVar2) {
          if (uVar2 == 0x11) {
            uVar2 = stbi__zreceive(a,3);
            uVar3 = 0;
          }
          else {
            if (uVar2 != 0x10) {
              uVar2 = stbi__zreceive(a,7);
              memset(lencodes + iVar5,0,(long)(int)(uVar2 + 0xb));
              iVar5 = iVar5 + uVar2 + 0xb;
              goto LAB_00104133;
            }
            uVar2 = stbi__zreceive(a,2);
            uVar3 = (uint)lencodes[(long)iVar5 + -1];
          }
          memset(lencodes + iVar5,uVar3,(long)(int)(uVar2 + 3));
          iVar5 = iVar5 + uVar2 + 3;
          goto LAB_00104133;
        }
        lencodes[iVar5] = (stbi_uc)uVar2;
        iVar5 = iVar5 + 1;
      } while( true );
    }
    if (stbi__zdefault_distance[0x1f] == '\0') {
      for (lVar9 = 0; lVar9 != 0x90; lVar9 = lVar9 + 1) {
        stbi__zdefault_length[lVar9] = '\b';
      }
      for (lVar9 = 0; lVar9 != 0x70; lVar9 = lVar9 + 1) {
        stbi__zdefault_length[lVar9 + 0x90] = '\t';
      }
      for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 1) {
        stbi__zdefault_length[lVar9 + 0x100] = '\a';
      }
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        stbi__zdefault_length[lVar9 + 0x118] = '\b';
      }
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
        stbi__zdefault_distance[lVar9] = '\x05';
      }
    }
    iVar5 = stbi__zbuild_huffman(z,stbi__zdefault_length,0x120);
    if (iVar5 == 0) {
      return 0;
    }
    psVar13 = stbi__zdefault_distance;
    num = 0x20;
    goto LAB_0010430d;
  }
  uVar2 = a->num_bits;
  if ((uVar2 & 7) != 0) {
    stbi__zreceive(a,uVar2 & 7);
    uVar2 = a->num_bits;
  }
  uVar8 = 0;
  while (0 < (int)uVar2) {
    uVar3 = a->code_buffer;
    *(char *)((long)z_codelength.fast + uVar8) = (char)uVar3;
    uVar8 = uVar8 + 1;
    a->code_buffer = uVar3 >> 8;
    uVar2 = uVar2 - 8;
    a->num_bits = uVar2;
  }
  if (uVar2 != 0) {
    __assert_fail("a->num_bits == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                  ,0xe8e,"int stbi__parse_uncomperssed_block(stbi__zbuf *)");
  }
  for (; uVar8 < 4; uVar8 = uVar8 + 1) {
    psVar13 = a->zbuffer;
    if (psVar13 < a->zbuffer_end) {
      a->zbuffer = psVar13 + 1;
      sVar10 = *psVar13;
    }
    else {
      sVar10 = '\0';
    }
    *(stbi_uc *)((long)z_codelength.fast + uVar8) = sVar10;
  }
  if ((z_codelength.fast[1] ^ z_codelength.fast[0]) == 0xffff) {
    psVar13 = a->zbuffer;
    uVar8 = (ulong)z_codelength.fast[0];
    if (a->zbuffer_end < psVar13 + uVar8) goto LAB_00104500;
    pcVar12 = a->zout;
    if (a->zout_end < pcVar12 + uVar8) {
      iVar5 = stbi__zexpand(a,pcVar12,(uint)z_codelength.fast[0]);
      if (iVar5 == 0) {
        return 0;
      }
      psVar13 = a->zbuffer;
      pcVar12 = a->zout;
    }
    memcpy(pcVar12,psVar13,uVar8);
    a->zbuffer = a->zbuffer + uVar8;
    a->zout = a->zout + uVar8;
    goto LAB_001044ec;
  }
  goto LAB_00104500;
LAB_001042d1:
  if (iVar5 == num + iVar6) {
    iVar5 = stbi__zbuild_huffman(z,lencodes,iVar6);
    if (iVar5 != 0) {
      psVar13 = lencodes + iVar6;
LAB_0010430d:
      iVar5 = stbi__zbuild_huffman(&a->z_distance,psVar13,num);
      if (iVar5 != 0) {
        pcVar12 = a->zout;
        while( true ) {
          while (iVar5 = stbi__zhuffman_decode(a,z), iVar5 < 0x100) {
            if (iVar5 < 0) goto LAB_00104500;
            if (a->zout_end <= pcVar12) {
              iVar6 = stbi__zexpand(a,pcVar12,1);
              if (iVar6 == 0) {
                return 0;
              }
              pcVar12 = a->zout;
            }
            *pcVar12 = (char)iVar5;
            pcVar12 = pcVar12 + 1;
          }
          if (iVar5 == 0x100) break;
          uVar8 = (ulong)(iVar5 - 0x101);
          uVar2 = stbi__zlength_base[uVar8];
          if (0xffffffffffffffeb < uVar8 - 0x1c) {
            uVar3 = stbi__zreceive(a,stbi__zlength_extra[uVar8]);
            uVar2 = uVar2 + uVar3;
          }
          uVar3 = stbi__zhuffman_decode(a,&a->z_distance);
          if ((int)uVar3 < 0) goto LAB_00104500;
          uVar8 = (ulong)uVar3;
          iVar5 = stbi__zdist_base[uVar8];
          if (0xffffffffffffffe5 < uVar8 - 0x1e) {
            uVar3 = stbi__zreceive(a,stbi__zdist_extra[uVar8]);
            iVar5 = iVar5 + uVar3;
          }
          if ((long)pcVar12 - (long)a->zout_start < (long)iVar5) goto LAB_00104500;
          if (a->zout_end < pcVar12 + (int)uVar2) {
            iVar6 = stbi__zexpand(a,pcVar12,uVar2);
            if (iVar6 == 0) {
              return 0;
            }
            pcVar12 = a->zout;
          }
          lVar9 = -(long)iVar5;
          if (iVar5 == 1) {
            if (uVar2 != 0) {
              memset(pcVar12,(uint)(byte)pcVar12[lVar9],(ulong)uVar2);
              pcVar12 = pcVar12 + (ulong)(uVar2 - 1) + 1;
            }
          }
          else {
            for (; uVar2 != 0; uVar2 = uVar2 - 1) {
              *pcVar12 = pcVar12[lVar9];
              pcVar12 = pcVar12 + 1;
            }
          }
        }
        a->zout = pcVar12;
LAB_001044ec:
        if (uVar1 != 0) {
          return 1;
        }
        goto LAB_0010401a;
      }
    }
  }
  else {
LAB_00104500:
    stbi__g_failure_reason = "Corrupt PNG";
  }
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}